

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O1

void __thiscall
SPP::EarthRotationFix(SPP *this,double deltat,XYZ SatPosition,NavSys flag,XYZ *fixed)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Matrix3d R;
  Vector3d pos;
  Vector3d result;
  double local_78;
  Matrix<double,_3,_3> local_60;
  Matrix<double,_3,_1> local_50;
  Matrix<double,_3,_1> local_40;
  
  local_50.data = (double *)0x0;
  local_50.rows = 3;
  local_50.cols = 1;
  local_50.data = (double *)operator_new__(0x18);
  local_60.data = (double *)0x0;
  local_60.rows = 3;
  local_60.cols = 3;
  local_60.data = (double *)operator_new__(0x48);
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_50,0,0);
  *pdVar3 = SatPosition.X;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_50,1,0);
  *pdVar3 = SatPosition.Y;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_50,2,0);
  *pdVar3 = SatPosition.Z;
  dVar1 = deltat * *(double *)(&DAT_001115e0 + (ulong)(flag == BDS) * 8);
  dVar2 = cos(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,0,0);
  *pdVar3 = dVar2;
  dVar2 = sin(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,0,1);
  *pdVar3 = dVar2;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,0,2);
  *pdVar3 = 0.0;
  local_78 = sin(dVar1);
  local_78 = -local_78;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,1,0);
  *pdVar3 = local_78;
  dVar1 = cos(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,1,1);
  *pdVar3 = dVar1;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,1,2);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,2,0);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,2,1);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_60,2,2);
  *pdVar3 = 1.0;
  local_40 = Matrix<double,3,3>::operator*((Matrix<double,3,3> *)&local_60,&local_50);
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_40,0,0);
  fixed->X = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_40,1,0);
  fixed->Y = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_40,2,0);
  fixed->Z = *pdVar3;
  if (local_40.data != (double *)0x0) {
    operator_delete__(local_40.data);
  }
  if (local_50.data != (double *)0x0) {
    operator_delete__(local_50.data);
  }
  if (local_60.data != (double *)0x0) {
    operator_delete__(local_60.data);
  }
  return;
}

Assistant:

void SPP::EarthRotationFix(double deltat, XYZ SatPosition, NavSys flag, XYZ &fixed)
{
    Vector3d pos;
    Matrix3d R;
    double rate;
    if(flag == GPS)
        rate = GPSROTATIONRATE;
    if(flag == BDS)
        rate = BDSROTATIONRATE;
    // GPS
    pos(0, 0) = SatPosition.X;
    pos(1, 0) = SatPosition.Y;
    pos(2, 0) = SatPosition.Z;

    R(0, 0) = cos(deltat * rate);
    R(0, 1) = sin(deltat * rate);
    R(0, 2) = 0;

    R(1, 0) = -sin(deltat * rate);
    R(1, 1) = cos(deltat * rate);
    R(1, 2) = 0;

    R(2, 0) = 0;
    R(2, 1) = 0;
    R(2, 2) = 1;

    Vector3d result = R * pos;
    fixed.X = result(0, 0);
    fixed.Y = result(1, 0);
    fixed.Z = result(2, 0);

    result.deleteMatrix();
    pos.deleteMatrix();
    R.deleteMatrix();
}